

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::SymbolsWrapper::doMoveFrom(SymbolsWrapper *this,SymbolsWrapper *src)

{
  SymbolsPointerType SVar1;
  
  SVar1 = src->fType;
  this->fType = SVar1;
  if (SVar1 - SYMPTR_DFS < 2) {
    this->fPtr = src->fPtr;
    (src->fPtr).dfs = (DecimalFormatSymbols *)0x0;
  }
  return;
}

Assistant:

void SymbolsWrapper::doMoveFrom(SymbolsWrapper&& src) {
    fType = src.fType;
    switch (fType) {
        case SYMPTR_NONE:
            // No action necessary
            break;
        case SYMPTR_DFS:
            fPtr.dfs = src.fPtr.dfs;
            src.fPtr.dfs = nullptr;
            break;
        case SYMPTR_NS:
            fPtr.ns = src.fPtr.ns;
            src.fPtr.ns = nullptr;
            break;
    }
}